

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
DoInitLetFld<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout,Var instance,
          PropertyOperationFlags flags)

{
  code *pcVar1;
  Var pvVar2;
  bool bVar3;
  PropertyId pid;
  undefined4 *puVar4;
  RecyclableObject *instance_00;
  Var newValue;
  InlineCache *pIStack_30;
  PropertyId propertyId;
  InlineCache *inlineCache;
  uint inlineCacheIndex;
  PropertyOperationFlags flags_local;
  Var instance_local;
  OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  inlineCache._0_4_ = playout->inlineCacheIndex;
  inlineCache._4_4_ = flags;
  _inlineCacheIndex = instance;
  instance_local = playout;
  playout_local = (OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *)this;
  pIStack_30 = GetInlineCache(this,(uint)inlineCache);
  bVar3 = TaggedNumber::Is(_inlineCacheIndex);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1378,"(!TaggedNumber::Is(instance))",
                                "!TaggedNumber::Is(instance)");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pid = GetPropertyIdFromCacheId(this,*(uint *)((long)instance_local + 8));
  pvVar2 = instance_local;
  instance_00 = UnsafeVarTo<Js::RecyclableObject>(_inlineCacheIndex);
  bVar3 = TrySetPropertyLocalFastPath<Js::OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
                    (this,(OpLayoutT_ElementCP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *)pvVar2,
                     pid,instance_00,&stack0xffffffffffffffd0,inlineCache._4_4_);
  pvVar2 = _inlineCacheIndex;
  if (!bVar3) {
    newValue = GetReg<unsigned_int>(this,*instance_local);
    Js::JavascriptOperators::OP_InitLetProperty(pvVar2,pid,newValue);
  }
  return;
}

Assistant:

void InterpreterStackFrame::DoInitLetFld(const unaligned T * playout, Var instance, PropertyOperationFlags flags)
    {
        uint inlineCacheIndex = playout->inlineCacheIndex;
        InlineCache * inlineCache = this->GetInlineCache(inlineCacheIndex);

        Assert(!TaggedNumber::Is(instance));
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        if (!TrySetPropertyLocalFastPath(playout, propertyId, UnsafeVarTo<RecyclableObject>(instance), inlineCache, flags))
        {
            JavascriptOperators::OP_InitLetProperty(instance, propertyId, GetReg(playout->Value));
        }
    }